

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void CorUnix::MTX_InternalLeaveCriticalSection
               (CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  PalCsInitState PVar1;
  HANDLE pVVar2;
  int iVar3;
  SIZE_T threadId;
  int iRet;
  PAL_CRITICAL_SECTION *pPalCriticalSection;
  PCRITICAL_SECTION pCriticalSection_local;
  CPalThread *pThread_local;
  
  PVar1 = ::Volatile::operator_cast_to_PalCsInitState((Volatile *)&pCriticalSection->dwInitState);
  if (PVar1 == PalCsNotInitialized) {
    fprintf(_stderr,"] %s %s:%d","MTX_InternalLeaveCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x601);
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar2 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,"MTX_InternalLeaveCriticalSection");
  if (pVVar2 != pCriticalSection->OwningThread) {
    fprintf(_stderr,"] %s %s:%d","MTX_InternalLeaveCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x604);
    fprintf(_stderr,"Expression: threadId == pPalCriticalSection->OwningThread\n");
  }
  if (pCriticalSection->RecursionCount < 1) {
    DebugBreak();
  }
  if (pCriticalSection->RecursionCount < 1) {
    fprintf(_stderr,"] %s %s:%d","MTX_InternalLeaveCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x609);
    fprintf(_stderr,"Expression: 0 < pPalCriticalSection->RecursionCount\n");
  }
  iVar3 = pCriticalSection->RecursionCount + -1;
  pCriticalSection->RecursionCount = iVar3;
  if (iVar3 < 1) {
    pCriticalSection->OwningThread = (HANDLE)0x0;
    iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&pCriticalSection->csnds);
    if (iVar3 != 0) {
      fprintf(_stderr,"] %s %s:%d","MTX_InternalLeaveCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x612);
      fprintf(_stderr,"Expression: 0 == iRet\n");
    }
  }
  return;
}

Assistant:

void MTX_InternalLeaveCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
#endif // MUTEX_BASED_CSS
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);
        int iRet;
#ifdef _DEBUG
        SIZE_T threadId;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);
        _ASSERTE(threadId == pPalCriticalSection->OwningThread);

        if (0 >= pPalCriticalSection->RecursionCount)
            DebugBreak();

        _ASSERTE(0 < pPalCriticalSection->RecursionCount);
#endif // _DEBUG

        if (0 < --pPalCriticalSection->RecursionCount)
            return;

        pPalCriticalSection->OwningThread = 0;

        iRet = pthread_mutex_unlock(&pPalCriticalSection->csndNativeData.mutex);
        _ASSERTE(0 == iRet);
    }